

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

void __thiscall rtosc::Ports::refreshMagic(Ports *this)

{
  ivec_t *assoc;
  char cVar1;
  char cVar2;
  pointer pPVar3;
  pointer pcVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  Port_Matcher *pPVar9;
  bool *pbVar10;
  char *pcVar11;
  pointer pbVar12;
  int *piVar13;
  ulong uVar14;
  int iVar15;
  iterator __end1;
  pointer pPVar16;
  ulong uVar17;
  _Alloc_hider _Var18;
  pointer pPVar19;
  iterator __begin1;
  pointer pbVar20;
  bool bVar21;
  bool bVar22;
  string tmp;
  int pos_best;
  char *arg;
  tvec_t hashed;
  cvec_t args;
  svec_t keys;
  int local_134;
  value_type local_130;
  int local_10c;
  ivec_t local_108;
  undefined1 local_e8 [40];
  Ports *local_c0;
  pointer local_b8;
  Port_Matcher *local_b0;
  ulong local_a8;
  pointer local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  int local_7c;
  vector<const_char_*,_std::allocator<const_char_*>_> local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  pointer local_38;
  
  pPVar9 = this->impl;
  if (pPVar9 != (Port_Matcher *)0x0) {
    Port_Matcher::~Port_Matcher(pPVar9);
    operator_delete(pPVar9,0x80);
  }
  pPVar9 = (Port_Matcher *)operator_new(0x80);
  pPVar19 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
            super__Vector_impl_data._M_start;
  pPVar3 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar17 = ((long)pPVar3 - (long)pPVar19 >> 3) * 0x6db6db6db6db6db7;
  pbVar10 = (bool *)operator_new__((long)(int)uVar17);
  pPVar9->m_enump = pbVar10;
  (pPVar9->fixed).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar9->fixed).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar9->fixed).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pPVar9->arg_spec).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar9->arg_spec).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar9->arg_spec).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pPVar9->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pPVar9->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pPVar9->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pPVar9->assoc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pPVar9->assoc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pPVar9->assoc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pPVar9->remap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pPVar9->remap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pPVar9->remap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->impl = pPVar9;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (char **)0x0;
  local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (char **)0x0;
  local_c0 = this;
  local_b0 = pPVar9;
  if (pPVar3 != pPVar19) {
    bVar22 = false;
    uVar14 = 1;
    pPVar16 = pPVar19;
    local_b8 = pPVar3;
    do {
      pcVar11 = strchr(pPVar16->name,0x23);
      if (pcVar11 != (char *)0x0) {
        bVar22 = true;
      }
      pPVar16 = pPVar16 + 1;
      bVar21 = uVar14 <= uVar17;
      lVar5 = uVar17 - uVar14;
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (bVar21 && lVar5 != 0);
    if (bVar22) goto LAB_001062da;
    if (local_b8 != pPVar19) {
      uVar17 = 0;
      uVar14 = 1;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,pPVar19[uVar17].name,(allocator<char> *)local_e8);
        local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (int *)0x0;
        uVar6 = std::__cxx11::string::find((char)&local_130,0x3a);
        if (0 < (int)uVar6) {
          local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)((local_c0->ports).
                               super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl
                               .super__Vector_impl_data._M_start[uVar17].name + (uVar6 & 0x7fffffff)
                              );
          std::__cxx11::string::substr((ulong)local_e8,(ulong)&local_130);
          std::__cxx11::string::operator=((string *)&local_130,(string *)local_e8);
          if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
            operator_delete((void *)local_e8._0_8_,
                            (ulong)((long)&(((_Vector_base<int,_std::allocator<int>_> *)
                                            local_e8._16_8_)->_M_impl).super__Vector_impl_data.
                                           _M_start + 1));
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_58,&local_130);
        if (local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                    ((vector<char_const*,std::allocator<char_const*>> *)&local_78,
                     (iterator)
                     local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(char **)&local_108);
        }
        else {
          *local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_finish =
               (char *)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
          local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        pPVar19 = (local_c0->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar17 = ((long)(local_c0->ports).
                        super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pPVar19 >> 3) * 0x6db6db6db6db6db7
        ;
        bVar22 = uVar14 <= uVar17;
        lVar5 = uVar17 - uVar14;
        uVar17 = uVar14;
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (bVar22 && lVar5 != 0);
    }
  }
  pPVar9 = local_b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&local_b0->fixed,&local_58);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator=(&pPVar9->arg_spec,&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_98,&local_58);
  pbVar12 = local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    uVar17 = (ulong)((long)local_98.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_98.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 5;
    iVar7 = 0;
    pbVar20 = local_98.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar4 = (pbVar20->_M_dataplus)._M_p;
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar4,pcVar4 + pbVar20->_M_string_length);
      if (iVar7 <= (int)local_130._M_string_length) {
        iVar7 = (int)local_130._M_string_length;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      pbVar20 = pbVar20 + 1;
    } while (pbVar20 != pbVar12);
    local_10c = -1;
    uVar6 = 0x7fffffff;
LAB_00105d72:
    local_134 = 0;
    if (0 < iVar7) {
      do {
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_130,
                   (vector<int,_std::allocator<int>_> *)&local_108);
        bVar22 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start ==
                 local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (bVar22) {
LAB_00105dc2:
          if (bVar22) {
            if (local_130._M_string_length == local_130.field_2._M_allocated_capacity) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_130,
                         (iterator)local_130._M_string_length,&local_134);
            }
            else {
              *(int *)local_130._M_string_length = local_134;
              local_130._M_string_length = local_130._M_string_length + 4;
            }
            do_hash((tvec_t *)local_e8,&local_98,(ivec_t *)&local_130);
            uVar8 = count_dups<std::vector<int,std::allocator<int>>>((tvec_t *)local_e8);
            if ((int)uVar8 < (int)uVar6) {
              local_10c = local_134;
              uVar6 = uVar8;
            }
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::~vector((tvec_t *)local_e8);
          }
        }
        else {
          iVar15 = *local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar13 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          while (iVar15 != local_134) {
            piVar13 = piVar13 + 1;
            bVar22 = piVar13 ==
                     local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (bVar22) goto LAB_00105dc2;
            iVar15 = *piVar13;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_130._M_dataplus._M_p,
                          local_130.field_2._M_allocated_capacity - (long)local_130._M_dataplus._M_p
                         );
        }
        local_134 = local_134 + 1;
      } while (local_134 < iVar7);
    }
    if ((int)uVar6 < (int)uVar17) {
      if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_108,
                   (iterator)
                   local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_10c);
        uVar17 = (ulong)uVar6;
      }
      else {
        *local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_10c;
        local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
        uVar17 = (ulong)uVar6;
      }
      goto LAB_00105d72;
    }
    do_hash((tvec_t *)&local_130,&local_98,&local_108);
    iVar7 = count_dups<std::vector<int,std::allocator<int>>>
                      ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)&local_130);
    pPVar9 = local_b0;
    if ((iVar7 != 0) &&
       (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start)) {
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&local_130);
    local_b8 = (pointer)&pPVar9->pos;
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              ((vector<int,_std::allocator<int>_> *)local_b8,&local_108);
    if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((pPVar9->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        (pPVar9->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      refreshMagic();
    }
    else {
      local_a0 = local_98.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      local_e8._16_8_ = (pointer)0x0;
      local_e8._0_8_ = (pointer)0x0;
      local_e8._8_8_ = (pointer)0x0;
      local_a8 = (long)local_98.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_98.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      if (local_a8 != 0) {
        pbVar12 = local_98.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          pcVar4 = (pbVar12->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,pcVar4,pcVar4 + pbVar12->_M_string_length);
          if ((int *)local_130._M_string_length != (int *)0x0) {
            piVar13 = (int *)(local_130._M_dataplus._M_p + local_130._M_string_length);
            _Var18._M_p = local_130._M_dataplus._M_p;
            do {
              cVar1 = *_Var18._M_p;
              local_10c = CONCAT31(local_10c._1_3_,cVar1);
              bVar22 = local_e8._0_8_ == local_e8._8_8_;
              if (bVar22) {
LAB_00105fbd:
                if (bVar22) {
                  if (local_e8._8_8_ == local_e8._16_8_) {
                    std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                              ((vector<char,std::allocator<char>> *)local_e8,
                               (iterator)local_e8._8_8_,(char *)&local_10c);
                  }
                  else {
                    *(char *)local_e8._8_8_ = cVar1;
                    local_e8._8_8_ = local_e8._8_8_ + 1;
                  }
                }
              }
              else {
                cVar2 = *(char *)&((_Alloc_hider *)local_e8._0_8_)->_M_p;
                pbVar20 = (pointer)local_e8._0_8_;
                while (cVar2 != cVar1) {
                  pbVar20 = (pointer)((long)&(pbVar20->_M_dataplus)._M_p + 1);
                  bVar22 = pbVar20 == (pointer)local_e8._8_8_;
                  if (bVar22) goto LAB_00105fbd;
                  cVar2 = *(char *)&(pbVar20->_M_dataplus)._M_p;
                }
              }
              _Var18._M_p = _Var18._M_p + 1;
            } while ((int *)_Var18._M_p != piVar13);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          pbVar12 = pbVar12 + 1;
        } while (pbVar12 != local_a0);
      }
      uVar17 = local_a8 >> 5;
      iVar7 = 0x7f;
      do {
        local_130._M_dataplus._M_p = local_130._M_dataplus._M_p & 0xffffffff00000000;
        if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_108,
                     (iterator)
                     local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_130);
        }
        else {
          *local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = 0;
          local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      iVar7 = -1;
      uVar6 = 0x7fffffff;
      iVar15 = 0;
      do {
        local_38 = (pointer)local_e8._8_8_;
        pbVar12 = (pointer)local_e8._0_8_;
        local_a8 = uVar17;
        local_7c = iVar15;
        if (local_e8._0_8_ != local_e8._8_8_) {
          do {
            cVar1 = *(char *)&(pbVar12->_M_dataplus)._M_p;
            uVar6 = 0x7fffffff;
            iVar15 = 0;
            local_a0 = pbVar12;
            do {
              local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[cVar1] = iVar15;
              do_hash((ivec_t *)&local_130,&local_98,(ivec_t *)local_b8,&local_108);
              uVar8 = count_dups<int>((vector<int,_std::allocator<int>_> *)&local_130);
              if ((int)uVar8 < (int)uVar6) {
                uVar6 = uVar8;
                iVar7 = iVar15;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_130._M_dataplus._M_p,
                                local_130.field_2._M_allocated_capacity -
                                (long)local_130._M_dataplus._M_p);
              }
              iVar15 = iVar15 + 1;
            } while (iVar15 != 100);
            local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[cVar1] = iVar7;
            pbVar12 = (pointer)((long)&(local_a0->_M_dataplus)._M_p + 1);
          } while (pbVar12 != local_38);
        }
        if ((int)local_a8 <= (int)uVar6) break;
        iVar15 = local_7c + 1;
        uVar17 = (ulong)uVar6;
      } while (iVar15 != 4);
      do_hash((ivec_t *)&local_130,&local_98,(ivec_t *)local_b8,&local_108);
      pPVar9 = local_b0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_130._M_dataplus._M_p,
                        local_130.field_2._M_allocated_capacity - (long)local_130._M_dataplus._M_p);
      }
      if ((pointer)local_e8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_e8._0_8_,local_e8._16_8_ - local_e8._0_8_);
      }
      assoc = &pPVar9->assoc;
      std::vector<int,_std::allocator<int>_>::_M_move_assign(assoc,&local_108);
      if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_e8._0_8_ = (pointer)0x0;
      local_e8._8_8_ = (pointer)0x0;
      local_e8._16_8_ = (pointer)0x0;
      do_hash((ivec_t *)&local_130,&local_98,(ivec_t *)local_b8,assoc);
      if (local_130._M_dataplus._M_p == (pointer)local_130._M_string_length) {
        iVar7 = 0;
      }
      else {
        iVar7 = 0;
        _Var18._M_p = local_130._M_dataplus._M_p;
        do {
          iVar15 = *(int *)_Var18._M_p + 1;
          if (*(int *)_Var18._M_p + 1 < iVar7) {
            iVar15 = iVar7;
          }
          iVar7 = iVar15;
          _Var18._M_p = _Var18._M_p + 4;
        } while (_Var18._M_p != (pointer)local_130._M_string_length);
      }
      if (0 < iVar7) {
        do {
          local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)((ulong)local_108.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000)
          ;
          if (local_e8._8_8_ == local_e8._16_8_) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)local_e8,(iterator)local_e8._8_8_,
                       (int *)&local_108);
          }
          else {
            *(int *)local_e8._8_8_ = 0;
            local_e8._8_8_ = local_e8._8_8_ + 4;
          }
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      uVar6 = (uint)(local_130._M_string_length - (long)local_130._M_dataplus._M_p >> 2);
      if (0 < (int)uVar6) {
        uVar17 = 0;
        do {
          *(int *)((long)&(((_Vector_base<int,_std::allocator<int>_> *)local_e8._0_8_)->_M_impl).
                          super__Vector_impl_data._M_start +
                  (long)*(int *)(local_130._M_dataplus._M_p + uVar17 * 4) * 4) = (int)uVar17;
          uVar17 = uVar17 + 1;
        } while ((uVar6 & 0x7fffffff) != uVar17);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_130._M_dataplus._M_p,
                        local_130.field_2._M_allocated_capacity - (long)local_130._M_dataplus._M_p);
      }
      std::vector<int,_std::allocator<int>_>::_M_move_assign(&pPVar9->remap,local_e8);
      if ((pointer)local_e8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_e8._0_8_,local_e8._16_8_ - local_e8._0_8_);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
LAB_001062da:
  if (local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  pPVar19 = (local_c0->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar6 = (int)((long)(local_c0->ports).
                      super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pPVar19 >> 3) * -0x49249249;
  if (0 < (int)uVar6) {
    pbVar10 = local_c0->impl->m_enump;
    uVar17 = 0;
    do {
      pcVar11 = strchr(pPVar19->name,0x23);
      pbVar10[uVar17] = pcVar11 != (char *)0x0;
      uVar17 = uVar17 + 1;
      pPVar19 = pPVar19 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar17);
  }
  local_c0->elms = uVar6;
  return;
}

Assistant:

void Ports::refreshMagic()
{
    delete impl;
    impl = new Port_Matcher(ports.size());
    generate_minimal_hash(*this, *impl);
    for(int i=0; i<(int)ports.size(); ++i)
        impl->set_enump(i, !!strchr(ports[i].name, '#'));

    elms = ports.size();
}